

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_platform.cpp
# Opt level: O0

int sprintf_s(char *buffer,size_t sizeOfBuffer,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int c;
  va_list args;
  int local_fc;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_20;
  size_t local_18;
  char *local_10;
  int local_4;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  if (in_RSI == 0) {
    local_4 = 0;
  }
  else {
    local_28 = local_f8;
    local_30 = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x18;
    local_e0 = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_fc = vsnprintf(in_RDI,in_RSI,in_RDX,&local_38);
    local_10[local_18 - 1] = '\0';
    local_4 = (int)local_18;
    if (local_fc < 0) {
      local_4 = local_4 + -1;
    }
    else {
      if (local_4 + -1 <= local_fc) {
        local_fc = local_4 + -1;
      }
      local_4 = local_fc;
    }
  }
  return local_4;
}

Assistant:

int sprintf_s(char *buffer, size_t sizeOfBuffer, const char *format, ...)
{
   if (!sizeOfBuffer)
      return 0;

   va_list args;
   va_start(args, format);
   int c = vsnprintf(buffer, sizeOfBuffer, format, args);
   va_end(args);

   buffer[sizeOfBuffer - 1] = '\0';

   if (c < 0)
      return static_cast<int>(sizeOfBuffer - 1);

   return LZHAM_MIN(c, (int)sizeOfBuffer - 1);
}